

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_codes_reader.c
# Opt level: O3

uint16_t aom_read_primitive_refsubexpfin_(aom_reader *r,uint16_t n,uint16_t k,uint16_t ref)

{
  short sVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  byte bVar6;
  uint16_t uVar7;
  undefined6 in_register_00000012;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  undefined6 in_register_00000032;
  uint uVar11;
  ulong uVar12;
  int iVar13;
  
  uVar8 = CONCAT62(in_register_00000012,k);
  uVar5 = (uint)CONCAT62(in_register_00000032,n);
  iVar13 = 0;
  if (3 << ((byte)k & 0x1f) < (int)uVar5) {
    uVar10 = uVar8 & 0xffffffff;
    uVar12 = uVar8 & 0xffffffff;
    iVar4 = iVar13;
    iVar13 = 0;
    do {
      iVar2 = od_ec_decode_bool_q15(&r->ec,0x4000);
      if (iVar2 == 0) {
        if ((int)uVar12 < 1) {
          uVar9 = 0;
        }
        else {
          uVar3 = (int)uVar12 + 1;
          uVar9 = 0;
          do {
            iVar4 = od_ec_decode_bool_q15(&r->ec,0x4000);
            uVar9 = uVar9 | iVar4 << ((char)uVar3 - 2U & 0x1f);
            uVar3 = uVar3 - 1;
          } while (1 < uVar3);
        }
        uVar9 = uVar9 + iVar13;
        goto LAB_00263620;
      }
      iVar13 = iVar13 + (1 << ((byte)uVar12 & 0x1f));
      bVar6 = (byte)uVar10;
      uVar10 = (ulong)((int)uVar10 + 1);
      uVar12 = (ulong)(uint)(iVar4 + (int)uVar8);
      iVar4 = iVar4 + 1;
    } while ((3 << (bVar6 & 0x1f)) + iVar13 < (int)uVar5);
  }
  uVar9 = 0;
  if (1 < (ushort)(uVar5 - iVar13)) {
    uVar3 = uVar5 - iVar13 & 0xffff;
    iVar4 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> iVar4 == 0; iVar4 = iVar4 + -1) {
      }
    }
    uVar11 = iVar4 + 1;
    do {
      iVar2 = od_ec_decode_bool_q15(&r->ec,0x4000);
      uVar9 = uVar9 | iVar2 << ((char)uVar11 - 2U & 0x1f);
      uVar11 = uVar11 - 1;
    } while (1 < uVar11);
    iVar4 = (2 << ((byte)iVar4 & 0x1f)) - uVar3;
    if (iVar4 <= (int)uVar9) {
      iVar2 = od_ec_decode_bool_q15(&r->ec,0x4000);
      uVar9 = (uVar9 * 2 - iVar4) + iVar2;
    }
  }
  uVar9 = uVar9 + iVar13;
LAB_00263620:
  uVar7 = (uint16_t)uVar9;
  uVar3 = (uint)ref * 2;
  if (uVar5 < uVar3) {
    uVar3 = (uVar5 - 1) - (uint)ref;
    uVar11 = uVar9 & 0xffff;
    if (uVar11 <= (uVar3 & 0xffff) * 2) {
      if ((uVar9 & 1) == 0) {
        sVar1 = (short)(uVar11 >> 1);
      }
      else {
        sVar1 = -(short)(uVar11 + 1 >> 1);
      }
      uVar7 = (short)uVar3 + sVar1;
    }
    uVar7 = (short)(uVar5 - 1) - uVar7;
  }
  else {
    uVar5 = uVar9 & 0xffff;
    if (uVar5 <= uVar3) {
      if ((uVar9 & 1) == 0) {
        sVar1 = (short)(uVar5 >> 1);
      }
      else {
        sVar1 = -(short)(uVar5 + 1 >> 1);
      }
      uVar7 = ref + sVar1;
    }
  }
  return uVar7;
}

Assistant:

uint16_t aom_read_primitive_refsubexpfin_(aom_reader *r, uint16_t n, uint16_t k,
                                          uint16_t ref ACCT_STR_PARAM) {
  return inv_recenter_finite_nonneg(
      n, ref, read_primitive_subexpfin(r, n, k, ACCT_STR_NAME));
}